

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor,Options *options)

{
  int iVar1;
  int iVar2;
  bool in_CL;
  long lVar3;
  
  this->descriptor_ = descriptor;
  ClassName_abi_cxx11_(&this->classname_,(cpp *)descriptor,(EnumDescriptor *)0x0,in_CL);
  this->options_ = options;
  iVar2 = *(int *)(*(long *)(descriptor + 0x30) + 0x10);
  if (0 < (long)*(int *)(descriptor + 0x2c)) {
    lVar3 = 0;
    do {
      iVar1 = *(int *)(*(long *)(descriptor + 0x30) + 0x10 + lVar3);
      if (iVar2 < iVar1) {
        iVar2 = iVar1;
      }
      lVar3 = lVar3 + 0x28;
    } while ((long)*(int *)(descriptor + 0x2c) * 0x28 != lVar3);
  }
  this->generate_array_size_ = iVar2 != 0x7fffffff;
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor),
    classname_(ClassName(descriptor, false)),
    options_(options),
    generate_array_size_(ShouldGenerateArraySize(descriptor)) {
}